

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

char * __thiscall
llvm::ItaniumPartialDemangler::getFunctionParameters
          (ItaniumPartialDemangler *this,char *Buf,size_t *N)

{
  void *pvVar1;
  size_t sVar2;
  OutputStream S;
  NodeArray Params;
  OutputStream local_48;
  NodeArray local_28;
  
  pvVar1 = this->RootNode;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("RootNode != nullptr && \"must call partialDemangle()\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                  ,0x145a,"bool llvm::ItaniumPartialDemangler::isFunction() const");
  }
  if (*(char *)((long)pvVar1 + 8) == '\x12') {
    local_28.Elements = *(Node ***)((long)pvVar1 + 0x20);
    local_28.NumElements = *(size_t *)((long)pvVar1 + 0x28);
    local_48.CurrentPackIndex = 0xffffffff;
    local_48.CurrentPackMax = 0xffffffff;
    if (Buf == (char *)0x0) {
      sVar2 = 0x80;
      Buf = (char *)malloc(0x80);
      if (Buf == (char *)0x0) goto LAB_001b0c32;
    }
    else {
      sVar2 = *N;
    }
    local_48.CurrentPosition = 0;
    local_48.Buffer = Buf;
    local_48.BufferCapacity = sVar2;
    OutputStream::grow(&local_48,1);
    local_48.Buffer[local_48.CurrentPosition] = '(';
    local_48.CurrentPosition = local_48.CurrentPosition + 1;
    anon_unknown.dwarf_448ecb::NodeArray::printWithComma(&local_28,&local_48);
    OutputStream::grow(&local_48,1);
    local_48.Buffer[local_48.CurrentPosition] = ')';
    local_48.CurrentPosition = local_48.CurrentPosition + 1;
    OutputStream::grow(&local_48,1);
    local_48.Buffer[local_48.CurrentPosition] = '\0';
    if (N != (size_t *)0x0) {
      *N = local_48.CurrentPosition + 1;
    }
  }
  else {
LAB_001b0c32:
    local_48.Buffer = (char *)0x0;
  }
  return local_48.Buffer;
}

Assistant:

bool ItaniumPartialDemangler::isFunction() const {
  assert(RootNode != nullptr && "must call partialDemangle()");
  return static_cast<Node *>(RootNode)->getKind() == Node::KFunctionEncoding;
}